

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.hpp
# Opt level: O3

char __thiscall Parse::TPTP::getChar(TPTP *this,int pos)

{
  int iVar1;
  ulong uVar2;
  char cVar3;
  
  if (this->_cend <= pos) {
    do {
      iVar1 = std::istream::get();
      cVar3 = (char)iVar1;
      if (iVar1 == -1) {
        cVar3 = '\0';
      }
      uVar2 = (ulong)this->_cend;
      this->_cend = this->_cend + 1;
      if ((this->_chars)._capacity <= uVar2) {
        Lib::Array<char>::expandToFit(&this->_chars,uVar2);
      }
      (this->_chars)._array[uVar2] = cVar3;
    } while (this->_cend <= pos);
  }
  uVar2 = (ulong)pos;
  if ((this->_chars)._capacity <= uVar2) {
    Lib::Array<char>::expandToFit(&this->_chars,uVar2);
  }
  return (this->_chars)._array[uVar2];
}

Assistant:

inline char getChar(int pos)
  {
    while (_cend <= pos) {
      int c = currentFile.in->get();
      //      if (c == -1) { std::cout << "<EOF>"; } else {std::cout << char(c);}
      _chars[_cend++] = c == -1 ? 0 : c;
    }
    return _chars[pos];
  }